

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.hpp
# Opt level: O1

MultiFileReaderBindData * __thiscall
duckdb::MultiFileReader::BindReader<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
          (MultiFileReaderBindData *__return_storage_ptr__,MultiFileReader *this,
          ClientContext *context,vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,MultiFileList *files,MultiFileBindData *result,ParquetOptions *options,
          MultiFileOptions *file_options)

{
  pointer pMVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  undefined4 uVar5;
  undefined8 uVar6;
  BaseFileReader *pBVar7;
  MultiFileColumnDefinition *column;
  pointer __args;
  shared_ptr<duckdb::BaseFileReader,_true> local_88;
  undefined1 local_78 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (file_options->union_by_name == true) {
    BindUnionReader<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
              (__return_storage_ptr__,this,context,return_types,names,files,result,options,
               file_options);
  }
  else {
    local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78._16_8_ = files;
    MultiFileList::GetFirstFile((OpenFileInfo *)(local_78 + 0x18),files);
    ParquetMultiFileInfo::CreateReader
              ((ClientContext *)local_78,(OpenFileInfo *)context,(ParquetOptions *)(local_78 + 0x18)
               ,(MultiFileOptions *)options);
    uVar6 = local_78._8_8_;
    local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_78._0_8_;
    this_01._M_pi =
         local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    local_78._0_8_ = (element_type *)0x0;
    local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_ != &local_50) {
      operator_delete((void *)local_78._24_8_);
    }
    pBVar7 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&local_88);
    pMVar1 = (pBVar7->columns).
             super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
             .
             super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args = (pBVar7->columns).
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                  .
                  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args != pMVar1; __args = __args + 1)
    {
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
                 &__args->type);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
                 &__args->name);
    }
    uVar2 = local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_;
    uVar3 = local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._4_4_;
    uVar4 = local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._0_4_;
    uVar5 = local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._4_4_;
    local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (result->initial_reader).internal.
              super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    *(undefined4 *)
     &(result->initial_reader).internal.
      super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar2;
    *(undefined4 *)
     ((long)&(result->initial_reader).internal.
             super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
         uVar3;
    *(undefined4 *)
     &(result->initial_reader).internal.
      super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         uVar4;
    *(undefined4 *)
     ((long)&(result->initial_reader).internal.
             super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi + 4) = uVar5;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    (__return_storage_ptr__->filename_idx).index = 0xffffffffffffffff;
    (__return_storage_ptr__->hive_partitioning_indexes).
    super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
    super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->hive_partitioning_indexes).
    super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
    super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->hive_partitioning_indexes).
    super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
    super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->schema).
    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    .
    super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->schema).
    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    .
    super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->schema).
    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    .
    super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->mapping = BY_NAME;
    (*this->_vptr_MultiFileReader[8])
              (this,file_options,local_78._16_8_,return_types,names,__return_storage_ptr__);
    if (local_88.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.internal.
                 super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MultiFileReaderBindData BindReader(ClientContext &context, vector<LogicalType> &return_types, vector<string> &names,
	                                   MultiFileList &files, MultiFileBindData &result, OPTIONS_TYPE &options,
	                                   MultiFileOptions &file_options) {
		if (file_options.union_by_name) {
			return BindUnionReader<OP>(context, return_types, names, files, result, options, file_options);
		} else {
			shared_ptr<BaseFileReader> reader;
			reader = OP::CreateReader(context, files.GetFirstFile(), options, file_options);
			auto &columns = reader->GetColumns();
			for (auto &column : columns) {
				return_types.emplace_back(column.type);
				names.emplace_back(column.name);
			}
			result.Initialize(std::move(reader));
			MultiFileReaderBindData bind_data;
			BindOptions(file_options, files, return_types, names, bind_data);
			return bind_data;
		}
	}